

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O2

void __thiscall
KDIS::KException::KException<char_const*>
          (KException *this,KString *Text,KUINT16 EC,char *AdditonalInfo)

{
  ostream *poVar1;
  KUINT16 ErrorCode;
  KStringStream ss;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  *(undefined ***)this = &PTR__KException_00216b08;
  this->m_ui16ErrorCode = EC;
  (this->m_sErrorText)._M_dataplus._M_p = (pointer)&(this->m_sErrorText).field_2;
  (this->m_sErrorText)._M_string_length = 0;
  (this->m_sErrorText).field_2._M_local_buf[0] = '\0';
  std::__cxx11::stringstream::stringstream(local_1b0);
  poVar1 = std::operator<<(local_1a0,(string *)Text);
  poVar1 = std::operator<<(poVar1,": ");
  GetErrorText_abi_cxx11_(&local_1d0,(KDIS *)(ulong)EC,ErrorCode);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,(string *)&this->m_sErrorText);
  std::operator<<(poVar1,AdditonalInfo);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&this->m_sErrorText,(string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return;
}

Assistant:

KException(const KString &Text, KUINT16 EC, T AdditonalInfo) :
        m_ui16ErrorCode( EC )
    {
        KStringStream ss;
        ss << Text << ": " << GetErrorText( EC ) << m_sErrorText << AdditonalInfo;
        m_sErrorText = ss.str();
    }